

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

ScriptBuilder * __thiscall cfd::core::ScriptBuilder::AppendData(ScriptBuilder *this,string *hex_str)

{
  pointer *__return_storage_ptr__;
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff58;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_datas;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *byte_array;
  string *hex_str_local;
  ScriptBuilder *this_local;
  
  __return_storage_ptr__ =
       &byte_datas.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  StringUtil::StringToByte
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             (string *)hex_str);
  WallyUtil::CreateScriptDataFromBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,0);
  __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      (in_stack_ffffffffffffff58);
  __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     (in_stack_ffffffffffffff58);
  __result = ::std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (&this->script_byte_array_);
  ::std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current,__result);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendData(const std::string& hex_str) {
  const std::vector<uint8_t>& byte_array = StringUtil::StringToByte(hex_str);
  std::vector<uint8_t> byte_datas =
      WallyUtil::CreateScriptDataFromBytes(byte_array);
  std::copy(
      byte_datas.begin(), byte_datas.end(),
      std::back_inserter(script_byte_array_));
  return *this;
}